

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O2

RK_S32 mpp_hevc_decode_nal_pps(HEVCContext *s)

{
  BitReadCtx_t *bitctx;
  HEVCSPS *pHVar1;
  MppDecHwCap *pMVar2;
  long lVar3;
  RK_U8 *pRVar4;
  char cVar5;
  MPP_RET MVar6;
  int iVar7;
  RK_U32 RVar8;
  RK_U32 *data;
  void *pvVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  RK_U32 *pRVar13;
  uint uVar14;
  RK_U32 RVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  RK_U32 _out;
  RK_U32 *local_48;
  HEVCSPS *local_40;
  ulong local_38;
  
  bitctx = &s->HEVClc->gb;
  data = (RK_U32 *)mpp_osal_calloc("mpp_hevc_decode_nal_pps",0x690);
  if (((byte)h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding PPS\n",(char *)0x0);
  }
  if (data == (RK_U32 *)0x0) {
    return -0x3ee;
  }
  MVar6 = mpp_read_ue(bitctx,&_out);
  bitctx->ret = MVar6;
  iVar7 = -0x3ec;
  if (MVar6 != MPP_OK) goto LAB_0019d4e5;
  uVar20 = (ulong)_out;
  if (0x3f < _out) {
    pcVar12 = "PPS id out of range: %d\n";
    uVar17 = uVar20;
    goto LAB_0019d4d9;
  }
  pRVar13 = (RK_U32 *)s->pps_list[uVar20];
  if ((RK_U32 *)s->pps_list[uVar20] == (RK_U32 *)0x0) {
    pRVar13 = data;
  }
  data[1] = _out;
  data[0xc] = 1;
  data[0xd] = 1;
  *(undefined2 *)(data + 0xe) = 0x101;
  *(undefined1 *)((long)data + 0x3d) = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  MVar6 = mpp_read_ue(bitctx,&_out);
  bitctx->ret = MVar6;
  if (MVar6 != MPP_OK) goto LAB_0019d4e0;
  uVar17 = (ulong)_out;
  *data = _out;
  if (uVar17 < 0x10) {
    pHVar1 = (HEVCSPS *)s->sps_list[uVar17];
    local_48 = pRVar13;
    if (pHVar1 == (HEVCSPS *)0x0) {
      pcVar12 = "SPS %u does not exist.\n";
      goto LAB_0019d4d9;
    }
    if (((byte)h265d_debug & 1) != 0) {
      _mpp_log_l(4,"H265PARSER_PS","Decoding PPS 1\n",(char *)0x0);
    }
    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
    bitctx->ret = MVar6;
    if (MVar6 == MPP_OK) {
      *(char *)((long)data + 0x2d) = (char)_out;
      MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      bitctx->ret = MVar6;
      if (MVar6 == MPP_OK) {
        *(char *)((long)data + 0x2b) = (char)_out;
        MVar6 = mpp_read_bits(bitctx,3,(RK_S32 *)&_out);
        bitctx->ret = MVar6;
        if (MVar6 == MPP_OK) {
          data[0x197] = _out;
          MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
          bitctx->ret = MVar6;
          if (MVar6 == MPP_OK) {
            *(char *)(data + 2) = (char)_out;
            MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            bitctx->ret = MVar6;
            if (MVar6 == MPP_OK) {
              *(char *)((long)data + 9) = (char)_out;
              local_40 = pHVar1;
              MVar6 = mpp_read_ue(bitctx,&_out);
              bitctx->ret = MVar6;
              if (MVar6 == MPP_OK) {
                data[3] = _out + 1;
                MVar6 = mpp_read_ue(bitctx,&_out);
                bitctx->ret = MVar6;
                if (MVar6 == MPP_OK) {
                  data[4] = _out + 1;
                  MVar6 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                  bitctx->ret = MVar6;
                  if (MVar6 == MPP_OK) {
                    data[5] = _out;
                    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                    bitctx->ret = MVar6;
                    if (MVar6 == MPP_OK) {
                      *(char *)(data + 6) = (char)_out;
                      MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                      bitctx->ret = MVar6;
                      if (MVar6 == MPP_OK) {
                        *(char *)((long)data + 0x19) = (char)_out;
                        MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                        bitctx->ret = MVar6;
                        if (MVar6 == MPP_OK) {
                          *(char *)((long)data + 0x1a) = (char)_out;
                          data[7] = 0;
                          if ((char)_out != '\0') {
                            MVar6 = mpp_read_ue(bitctx,&_out);
                            bitctx->ret = MVar6;
                            if (MVar6 != MPP_OK) goto LAB_0019d4e0;
                            data[7] = _out;
                          }
                          MVar6 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                          bitctx->ret = MVar6;
                          if (MVar6 == MPP_OK) {
                            uVar17 = (ulong)_out;
                            data[8] = _out;
                            if (_out - 0xd < 0xffffffe7) {
                              pcVar12 = "pps_cb_qp_offset out of range: %d\n";
                              goto LAB_0019d4d9;
                            }
                            MVar6 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                            bitctx->ret = MVar6;
                            if (MVar6 == MPP_OK) {
                              uVar17 = (ulong)_out;
                              data[9] = _out;
                              if (_out - 0xd < 0xffffffe7) {
                                pcVar12 = "pps_cr_qp_offset out of range: %d\n";
                                goto LAB_0019d4d9;
                              }
                              MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                              bitctx->ret = MVar6;
                              if (MVar6 == MPP_OK) {
                                *(char *)(data + 10) = (char)_out;
                                MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                bitctx->ret = MVar6;
                                if (MVar6 == MPP_OK) {
                                  *(char *)((long)data + 0x29) = (char)_out;
                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                  bitctx->ret = MVar6;
                                  if (MVar6 == MPP_OK) {
                                    *(char *)((long)data + 0x2a) = (char)_out;
                                    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                    bitctx->ret = MVar6;
                                    if (MVar6 == MPP_OK) {
                                      *(char *)(data + 0xb) = (char)_out;
                                      MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                      bitctx->ret = MVar6;
                                      if (MVar6 == MPP_OK) {
                                        *(char *)((long)data + 0x2e) = (char)_out;
                                        MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                        bitctx->ret = MVar6;
                                        if (MVar6 == MPP_OK) {
                                          *(char *)((long)data + 0x2f) = (char)_out;
                                          pMVar2 = s->h265dctx->hw_info;
                                          if (pMVar2 != (MppDecHwCap *)0x0) {
                                            uVar10 = (uint)*(undefined8 *)&pMVar2->field_0x4;
                                            if ((uVar10 >> 0x14 & 1) == 0) {
                                              uVar14 = local_40->width;
                                              uVar18 = local_40->height;
                                              iVar7 = uVar18 * uVar14;
                                              iVar11 = (uVar10 & 0xe00000) * 0x20;
                                              if (iVar7 != iVar11 &&
                                                  SBORROW4(iVar7,iVar11) ==
                                                  (int)(iVar7 + (uVar10 & 0xe00000) * -0x20) < 0) {
                                                uVar17 = 0x2000;
                                                uVar22 = 0x2000;
LAB_0019d6fc:
                                                iVar7 = 0;
                                                _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                      
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,(ulong)uVar14,(ulong)uVar18,uVar17,
                                                  uVar22);
                                                goto LAB_0019d4e5;
                                              }
                                            }
                                            else {
                                              cVar5 = *(char *)((long)data + 0x2e);
                                              if ((uVar10 >> 0xd & 1) == 0) {
                                                uVar14 = 0x440;
                                                if (cVar5 == '\0') {
                                                  uVar14 = 0x780;
                                                }
                                                uVar18 = 0x900;
                                                if (cVar5 == '\0') {
                                                  uVar18 = 0x1000;
                                                }
                                                bVar21 = (uVar10 >> 0xc & 1) == 0;
                                                uVar10 = 0x1000;
                                                if (bVar21) {
                                                  uVar10 = 0x780;
                                                }
                                                uVar17 = (ulong)uVar10;
                                                if (bVar21) {
                                                  uVar18 = uVar14;
                                                }
                                                uVar22 = (ulong)uVar18;
                                              }
                                              else {
                                                uVar17 = 0x2000;
                                                uVar22 = 0x10e0;
                                                if (cVar5 == '\0') {
                                                  uVar22 = 0x2000;
                                                }
                                              }
                                              uVar14 = local_40->width;
                                              uVar18 = local_40->height;
                                              iVar7 = (int)uVar17;
                                              if (((iVar7 < (int)uVar14) ||
                                                  ((int)uVar22 < (int)uVar18 && cVar5 != '\0')) ||
                                                 (iVar7 * iVar7 < (int)(uVar18 * uVar14)))
                                              goto LAB_0019d6fc;
                                            }
                                          }
                                          if (*(char *)((long)data + 0x2e) == '\0') {
LAB_0019d875:
                                            MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                            bitctx->ret = MVar6;
                                            if (MVar6 == MPP_OK) {
                                              *(char *)((long)data + 0x3a) = (char)_out;
                                              MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                              bitctx->ret = MVar6;
                                              if (MVar6 == MPP_OK) {
                                                *(char *)((long)data + 0x3b) = (char)_out;
                                                if ((char)_out == '\0') {
LAB_0019d909:
                                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 == MPP_OK) {
                                                    *(char *)(data + 0x12) = (char)_out;
                                                    if ((char)_out != '\0') {
                                                      set_default_scaling_list_data
                                                                ((ScalingList *)((long)data + 0x49))
                                                      ;
                                                      iVar7 = scaling_list_data(s,(ScalingList *)
                                                                                  ((long)data + 0x49
                                                                                  ),local_40);
                                                      if (iVar7 < 0) goto LAB_0019d4e5;
                                                      s->scaling_list_listen[uVar20 + 0x10] = '\x01'
                                                      ;
                                                    }
                                                    if (((byte)h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  }
                                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 == MPP_OK) {
                                                    *(char *)((long)data + 0x655) = (char)_out;
                                                    if (((byte)h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  }
                                                  MVar6 = mpp_read_ue(bitctx,&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 == MPP_OK) {
                                                    data[0x196] = _out;
                                                    uVar10 = _out;
                                                    if (((byte)h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  uVar10 = data[0x196];
                                                  }
                                                  uVar17 = (ulong)uVar10;
                                                  data[0x196] = uVar10 + 2;
                                                  if (local_40->log2_ctb_size < (int)(uVar10 + 2)) {
                                                    pcVar12 = 
                                                  "log2_parallel_merge_level_minus2 out of range: %d\n"
                                                  ;
                                                  goto LAB_0019d4d9;
                                                  }
                                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 == MPP_OK) {
                                                    *(char *)(data + 0x198) = (char)_out;
                                                    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                    bitctx->ret = MVar6;
                                                    if (MVar6 == MPP_OK) {
                                                      *(char *)((long)data + 0x661) = (char)_out;
                                                      cVar5 = (char)_out;
                                                      if (((byte)h265d_debug & 8) != 0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "pps_extension_flag %d",
                                                                   (char *)0x0);
                                                        cVar5 = *(char *)((long)data + 0x661);
                                                      }
                                                      if (cVar5 != '\0') {
                                                        MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)
                                                                                       &_out);
                                                        bitctx->ret = MVar6;
                                                        if (MVar6 != MPP_OK) goto LAB_0019d4e0;
                                                        *(char *)((long)data + 0x662) = (char)_out;
                                                        MVar6 = mpp_skip_longbits(bitctx,7);
                                                        bitctx->ret = MVar6;
                                                        iVar7 = -0x3ec;
                                                        if (MVar6 != MPP_OK) goto LAB_0019d4e5;
                                                      }
                                                      pvVar9 = s->h265dctx->compare_info;
                                                      if (pvVar9 != (void *)0x0) {
                                                        lVar19 = uVar20 * 0x690;
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "compare pps in",(char *)0x0);
                                                        if (*(RK_U32 *)
                                                             ((long)pvVar9 + lVar19 + 0x39b80) !=
                                                            *data) {
                                                          pcVar12 = "sps_id diff \n";
LAB_0019e18b:
                                                          _mpp_log_l(4,"H265PARSER_PS",pcVar12,
                                                                     (char *)0x0);
                                                          _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                          
                                                  "compare pps with openhevc error found",
                                                  (char *)0x0);
                                                  _mpp_log_l(2,"H265PARSER_PS",
                                                             "Assertion %s failed at %s:%d\n",
                                                             (char *)0x0,"0",
                                                             "mpp_hevc_decode_nal_pps",0x88b);
                                                  if ((mpp_debug._3_1_ & 0x10) != 0) {
                                                    abort();
                                                  }
                                                  return -1;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39b84)
                                                      != data[1]) {
                                                    pcVar12 = "pps_id diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39b88) !=
                                                      (char)data[2]) {
                                                    pcVar12 = "sign_data_hiding_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39b89) !=
                                                      *(char *)((long)data + 9)) {
                                                    pcVar12 = "cabac_init_present_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39b8c)
                                                      != data[3]) {
                                                    pcVar12 = 
                                                  "num_ref_idx_l0_default_active diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39b90)
                                                      != data[4]) {
                                                    pcVar12 = 
                                                  "num_ref_idx_l1_default_active diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39b94)
                                                      != data[5]) {
                                                    pcVar12 = "pic_init_qp_minus26 diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39b98) !=
                                                      (char)data[6]) {
                                                    pcVar12 = "constrained_intra_pred_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39b99) !=
                                                      *(char *)((long)data + 0x19)) {
                                                    pcVar12 = "transform_skip_enabled_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39b9a) !=
                                                      *(char *)((long)data + 0x1a)) {
                                                    pcVar12 = "cu_qp_delta_enabled_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39b9c)
                                                      != data[7]) {
                                                    pcVar12 = "diff_cu_qp_delta_depth diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39ba0)
                                                      != data[8]) {
                                                    pcVar12 = "cb_qp_offset diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39ba4)
                                                      != data[9]) {
                                                    pcVar12 = "cr_qp_offset diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39ba8) !=
                                                      (char)data[10]) {
                                                    pcVar12 = 
                                                  "pic_slice_level_chroma_qp_offsets_present_flag diff \n"
                                                  ;
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39ba9) !=
                                                      *(char *)((long)data + 0x29)) {
                                                    pcVar12 = "weighted_pred_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39baa) !=
                                                      *(char *)((long)data + 0x2a)) {
                                                    pcVar12 = "weighted_bipred_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bab) !=
                                                      *(char *)((long)data + 0x2b)) {
                                                    pcVar12 = "output_flag_present_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bac) !=
                                                      (char)data[0xb]) {
                                                    pcVar12 = 
                                                  "transquant_bypass_enable_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bad) !=
                                                      *(char *)((long)data + 0x2d)) {
                                                    pcVar12 = 
                                                  "dependent_slice_segments_enabled_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bae) !=
                                                      *(char *)((long)data + 0x2e)) {
                                                    pcVar12 = "tiles_enabled_flag diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39baf) !=
                                                      *(char *)((long)data + 0x2f)) {
                                                    pcVar12 = 
                                                  "entropy_coding_sync_enabled_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39bb0)
                                                      != data[0xc]) {
                                                    pcVar12 = "num_tile_columns diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39bb4)
                                                      != data[0xd]) {
                                                    pcVar12 = "num_tile_rows diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bb8) !=
                                                      (char)data[0xe]) {
                                                    pcVar12 = "qp_bd_offset diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bb9) !=
                                                      *(char *)((long)data + 0x39)) {
                                                    pcVar12 = 
                                                  "loop_filter_across_tiles_enabled_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bba) !=
                                                      *(char *)((long)data + 0x3a)) {
                                                    pcVar12 = 
                                                  "seq_loop_filter_across_slices_enabled_flag diff \n"
                                                  ;
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bbb) !=
                                                      *(char *)((long)data + 0x3b)) {
                                                    pcVar12 = 
                                                  "deblocking_filter_control_present_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bbc) !=
                                                      (char)data[0xf]) {
                                                    pcVar12 = 
                                                  "deblocking_filter_override_enabled_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bbd) !=
                                                      *(char *)((long)data + 0x3d)) {
                                                    pcVar12 = "disable_dbf diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39bc0)
                                                      != data[0x10]) {
                                                    pcVar12 = "beta_offset diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x39bc4)
                                                      != data[0x11]) {
                                                    pcVar12 = "tc_offset diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x39bc8) !=
                                                      (char)data[0x12]) {
                                                    pcVar12 = 
                                                  "scaling_list_data_present_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(char *)((long)pvVar9 + lVar19 + 0x3a1d5) !=
                                                      *(char *)((long)data + 0x655)) {
                                                    pcVar12 = 
                                                  "lists_modification_present_flag diff \n";
                                                  goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x3a1d8)
                                                      != data[0x196]) {
                                                    pcVar12 = "log2_parallel_merge_level diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  if (*(RK_U32 *)((long)pvVar9 + lVar19 + 0x3a1dc)
                                                      != data[0x197]) {
                                                    pcVar12 = "num_extra_slice_header_bits diff \n";
                                                    goto LAB_0019e18b;
                                                  }
                                                  _mpp_log_l(4,"H265PARSER_PS","compare pps ok",
                                                             (char *)0x0);
                                                  }
                                                  if ((char)data[0xe] == '\0') {
LAB_0019e23d:
                                                    if (s->pps_list[uVar20] == (RK_U8 *)0x0) {
                                                      s->pps_list[uVar20] = (RK_U8 *)data;
                                                      s->ps_need_upate = '\x01';
                                                    }
                                                    else {
                                                      memcpy(s->pps_list[uVar20],data,0x678);
                                                      mpp_hevc_pps_free((RK_U8 *)data);
                                                      pRVar4 = s->pps_list[uVar20];
                                                      s->ps_need_upate = '\x01';
                                                      if (pRVar4 == (RK_U8 *)0x0) {
                                                        return 0;
                                                      }
                                                    }
                                                    s->pps_list_of_updated[uVar20] = '\x01';
                                                    return 0;
                                                  }
                                                  RVar8 = data[0xc] * 4;
                                                  if ((int)local_48[0x1a2] < (int)RVar8) {
                                                    pvVar9 = mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)(int)RVar8);
                                                  *(void **)(local_48 + 0x19e) = pvVar9;
                                                  local_48[0x1a2] = RVar8;
                                                  }
                                                  RVar8 = data[0xd] * 4;
                                                  if ((int)local_48[0x1a3] < (int)RVar8) {
                                                    pvVar9 = mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)(int)RVar8);
                                                  *(void **)(local_48 + 0x1a0) = pvVar9;
                                                  local_48[0x1a3] = RVar8;
                                                  }
                                                  lVar19 = *(long *)(local_48 + 0x19e);
                                                  iVar7 = -0x3ee;
                                                  if ((lVar19 != 0) &&
                                                     (lVar3 = *(long *)(local_48 + 0x1a0),
                                                     lVar3 != 0)) {
                                                    lVar16 = 0;
                                                    while (RVar8 = data[0xc], lVar16 < (int)RVar8) {
                                                      *(int *)(lVar19 + lVar16 * 4) =
                                                           ((int)(lVar16 + 1) * local_40->ctb_width)
                                                           / (int)RVar8 -
                                                           ((int)lVar16 * local_40->ctb_width) /
                                                           (int)RVar8;
                                                      lVar16 = lVar16 + 1;
                                                    }
                                                    lVar19 = 0;
                                                    while (RVar8 = data[0xd], lVar19 < (int)RVar8) {
                                                      *(int *)(lVar3 + lVar19 * 4) =
                                                           ((int)(lVar19 + 1) * local_40->ctb_height
                                                           ) / (int)RVar8 -
                                                           ((int)lVar19 * local_40->ctb_height) /
                                                           (int)RVar8;
                                                      lVar19 = lVar19 + 1;
                                                    }
                                                    goto LAB_0019e23d;
                                                  }
                                                  goto LAB_0019d4e5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 == MPP_OK) {
                                                    *(char *)(data + 0xf) = (char)_out;
                                                    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                    bitctx->ret = MVar6;
                                                    if (MVar6 == MPP_OK) {
                                                      *(char *)((long)data + 0x3d) = (char)_out;
                                                      if ((char)_out != '\0') goto LAB_0019d909;
                                                      MVar6 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                                      bitctx->ret = MVar6;
                                                      if (MVar6 == MPP_OK) {
                                                        data[0x10] = _out * 2;
                                                        MVar6 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                                        bitctx->ret = MVar6;
                                                        if (MVar6 == MPP_OK) {
                                                          uVar17 = (ulong)_out;
                                                          data[0x11] = _out * 2;
                                                          if (data[0x10] - 0xe < 0xffffffe5) {
                                                            pcVar12 = 
                                                  "pps_beta_offset_div2 out of range: %d\n";
                                                  uVar17 = (long)(int)data[0x10] / 2 & 0xffffffff;
                                                  }
                                                  else {
                                                    if (0xfffffff2 < _out - 7) goto LAB_0019d909;
                                                    pcVar12 = 
                                                  "pps_tc_offset_div2 out of range: %d\n";
                                                  }
                                                  goto LAB_0019d4d9;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            MVar6 = mpp_read_ue(bitctx,&_out);
                                            bitctx->ret = MVar6;
                                            if (MVar6 == MPP_OK) {
                                              data[0xc] = _out + 1;
                                              MVar6 = mpp_read_ue(bitctx,&_out);
                                              bitctx->ret = MVar6;
                                              if (MVar6 == MPP_OK) {
                                                RVar8 = _out + 1;
                                                data[0xd] = RVar8;
                                                RVar15 = data[0xc];
                                                if ((RVar15 == 0) ||
                                                   (local_40->width <= (int)RVar15)) {
                                                  uVar17 = (ulong)(RVar15 - 1);
                                                  pcVar12 = 
                                                  "num_tile_columns_minus1 out of range: %d\n";
                                                }
                                                else {
                                                  if ((RVar8 != 0) &&
                                                     ((int)RVar8 < local_40->height)) {
                                                    RVar15 = RVar15 * 4;
                                                    if ((int)local_48[0x1a2] < (int)RVar15) {
                                                      pvVar9 = mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)(int)RVar15);
                                                  *(void **)(local_48 + 0x19e) = pvVar9;
                                                  local_48[0x1a2] = RVar15;
                                                  RVar8 = data[0xd];
                                                  }
                                                  RVar15 = RVar8 * 4;
                                                  if (SBORROW4(local_48[0x1a3],RVar15) !=
                                                      (int)(local_48[0x1a3] + RVar8 * -4) < 0) {
                                                    pvVar9 = mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)(int)RVar15);
                                                  *(void **)(local_48 + 0x1a0) = pvVar9;
                                                  local_48[0x1a3] = RVar15;
                                                  }
                                                  iVar7 = -0x3ee;
                                                  if ((*(long *)(local_48 + 0x19e) == 0) ||
                                                     (*(long *)(local_48 + 0x1a0) == 0))
                                                  goto LAB_0019d4e5;
                                                  MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar6;
                                                  if (MVar6 != MPP_OK) goto LAB_0019d4e0;
                                                  *(char *)(data + 0xe) = (char)_out;
                                                  if ((char)_out == '\0') {
                                                    local_38 = 0;
                                                    for (lVar19 = 0;
                                                        lVar19 < (long)(int)data[0xc] + -1;
                                                        lVar19 = lVar19 + 1) {
                                                      MVar6 = mpp_read_ue(bitctx,&_out);
                                                      bitctx->ret = MVar6;
                                                      if (MVar6 != MPP_OK) goto LAB_0019d4e0;
                                                      lVar3 = *(long *)(local_48 + 0x19e);
                                                      *(RK_U32 *)(lVar3 + lVar19 * 4) = _out;
                                                      iVar7 = *(int *)(lVar3 + lVar19 * 4);
                                                      *(int *)(lVar3 + lVar19 * 4) = iVar7 + 1;
                                                      local_38 = (ulong)((int)local_38 + iVar7 + 1);
                                                    }
                                                    iVar7 = local_40->ctb_width - (int)local_38;
                                                    if (iVar7 == 0 ||
                                                        local_40->ctb_width < (int)local_38) {
                                                      pcVar12 = "Invalid tile widths.\n";
                                                    }
                                                    else {
                                                      *(int *)(*(long *)(local_48 + 0x19e) + -4 +
                                                              (long)(int)data[0xc] * 4) = iVar7;
                                                      local_38 = 0;
                                                      for (lVar19 = 0;
                                                          lVar19 < (long)(int)data[0xd] + -1;
                                                          lVar19 = lVar19 + 1) {
                                                        MVar6 = mpp_read_ue(bitctx,&_out);
                                                        bitctx->ret = MVar6;
                                                        if (MVar6 != MPP_OK) goto LAB_0019d4e0;
                                                        lVar3 = *(long *)(local_48 + 0x1a0);
                                                        *(RK_U32 *)(lVar3 + lVar19 * 4) = _out;
                                                        iVar7 = *(int *)(lVar3 + lVar19 * 4);
                                                        *(int *)(lVar3 + lVar19 * 4) = iVar7 + 1;
                                                        local_38 = (ulong)((int)local_38 + iVar7 + 1
                                                                          );
                                                      }
                                                      iVar7 = local_40->ctb_height - (int)local_38;
                                                      if (iVar7 != 0 &&
                                                          (int)local_38 <= local_40->ctb_height) {
                                                        *(int *)(*(long *)(local_48 + 0x1a0) + -4 +
                                                                (long)(int)data[0xd] * 4) = iVar7;
                                                        goto LAB_0019d852;
                                                      }
                                                      pcVar12 = "Invalid tile heights.\n";
                                                    }
                                                    _mpp_log_l(2,"H265PARSER_PS",pcVar12,(char *)0x0
                                                              );
                                                  }
                                                  else {
LAB_0019d852:
                                                    MVar6 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                    bitctx->ret = MVar6;
                                                    if (MVar6 == MPP_OK) {
                                                      *(char *)((long)data + 0x39) = (char)_out;
                                                      goto LAB_0019d875;
                                                    }
                                                  }
                                                  goto LAB_0019d4e0;
                                                  }
                                                  pcVar12 = 
                                                  "num_tile_rows_minus1 out of range: %d\n";
                                                  uVar17 = (ulong)_out;
                                                }
                                                goto LAB_0019d4d9;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    pcVar12 = "SPS id out of range: %d\n";
LAB_0019d4d9:
    _mpp_log_l(2,"H265PARSER_PS",pcVar12,(char *)0x0,uVar17);
  }
LAB_0019d4e0:
  iVar7 = -0x3ec;
LAB_0019d4e5:
  mpp_hevc_pps_free((RK_U8 *)data);
  return iVar7;
}

Assistant:

int mpp_hevc_decode_nal_pps(HEVCContext *s)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    HEVCSPS *sps = NULL;
    HEVCPPS *pps = mpp_calloc(HEVCPPS, 1);
    HevcPpsBufInfo *bufs = NULL;
    RK_S32 buf_size = 0;
    RK_U32 pps_id = 0;
    RK_S32 ret = 0;
    RK_S32 i;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS\n");

    if (!pps)
        return MPP_ERR_NOMEM;

    // Coded parameters
    READ_UE(gb, &pps_id);
    if (pps_id >= MAX_PPS_COUNT) {
        mpp_err( "PPS id out of range: %d\n", pps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }

    if (s->pps_list[pps_id]) {
        bufs = &(((HEVCPPS *)s->pps_list[pps_id])->bufs);
    } else {
        bufs = &pps->bufs;
    }

    pps->pps_id = pps_id;
    // Default values
    pps->loop_filter_across_tiles_enabled_flag = 1;
    pps->num_tile_columns                      = 1;
    pps->num_tile_rows                         = 1;
    pps->uniform_spacing_flag                  = 1;
    pps->disable_dbf                           = 0;
    pps->beta_offset                           = 0;
    pps->tc_offset                             = 0;

    READ_UE(gb, &pps->sps_id);
    if (pps->sps_id >= MAX_SPS_COUNT) {
        mpp_err( "SPS id out of range: %d\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    if (!s->sps_list[pps->sps_id]) {
        mpp_err( "SPS %u does not exist.\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    sps = (HEVCSPS *)s->sps_list[pps->sps_id];

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS 1\n");
    READ_ONEBIT(gb, &pps->dependent_slice_segments_enabled_flag);
    READ_ONEBIT(gb, &pps->output_flag_present_flag );
    READ_BITS(gb, 3, &pps->num_extra_slice_header_bits);

    READ_ONEBIT(gb, &pps->sign_data_hiding_flag);

    READ_ONEBIT(gb, &pps->cabac_init_present_flag);

    READ_UE(gb, &pps->num_ref_idx_l0_default_active);
    pps->num_ref_idx_l0_default_active +=  1;
    READ_UE(gb, &pps->num_ref_idx_l1_default_active);
    pps->num_ref_idx_l1_default_active += 1;

    READ_SE(gb, &pps->pic_init_qp_minus26);

    READ_ONEBIT(gb, & pps->constrained_intra_pred_flag);
    READ_ONEBIT(gb, &pps->transform_skip_enabled_flag);

    READ_ONEBIT(gb, &pps->cu_qp_delta_enabled_flag);
    pps->diff_cu_qp_delta_depth   = 0;
    if (pps->cu_qp_delta_enabled_flag)
        READ_UE(gb, &pps->diff_cu_qp_delta_depth);

    READ_SE(gb, &pps->cb_qp_offset);
    if (pps->cb_qp_offset < -12 || pps->cb_qp_offset > 12) {
        mpp_err( "pps_cb_qp_offset out of range: %d\n",
                 pps->cb_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_SE(gb, &pps->cr_qp_offset);
    if (pps->cr_qp_offset < -12 || pps->cr_qp_offset > 12) {
        mpp_err( "pps_cr_qp_offset out of range: %d\n",
                 pps->cr_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->pic_slice_level_chroma_qp_offsets_present_flag);

    READ_ONEBIT(gb, &pps->weighted_pred_flag);

    READ_ONEBIT(gb, &pps->weighted_bipred_flag);

    READ_ONEBIT(gb, &pps->transquant_bypass_enable_flag);
    READ_ONEBIT(gb, &pps->tiles_enabled_flag);
    READ_ONEBIT(gb, &pps->entropy_coding_sync_enabled_flag);

    // check support solution
    if (s->h265dctx->hw_info) {
        const MppDecHwCap *hw_info = s->h265dctx->hw_info;

        if (hw_info->cap_lmt_linebuf) {
            RK_S32 max_supt_width = PIXW_1080P;
            RK_S32 max_supt_height = pps->tiles_enabled_flag ? PIXH_1080P : PIXW_1080P;

            if (hw_info && hw_info->cap_8k) {
                max_supt_width = PIXW_8Kx4K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_8Kx4K : PIXW_8Kx4K;
            } else if (hw_info && hw_info->cap_4k) {
                max_supt_width = PIXW_4Kx2K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_4Kx2K : PIXW_4Kx2K;
            }

            if (sps->width > max_supt_width || (sps->height > max_supt_height && pps->tiles_enabled_flag)
                || sps->width * sps->height > max_supt_width * max_supt_width) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, max_supt_width, max_supt_height);
                goto err;
            }
        } else {
            if (sps->width * sps->height > PIXW_8Kx4K * PIXW_8Kx4K * hw_info->cap_core_num) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, PIXW_8Kx4K, PIXW_8Kx4K);
                goto err;
            }
        }
    }

    if (pps->tiles_enabled_flag) {
        READ_UE(gb, &pps->num_tile_columns);
        pps->num_tile_columns += 1;
        READ_UE(gb, &pps->num_tile_rows);
        pps->num_tile_rows += 1;
        if (pps->num_tile_columns == 0 ||
            pps->num_tile_columns >= sps->width) {
            mpp_err( "num_tile_columns_minus1 out of range: %d\n",
                     pps->num_tile_columns - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }
        if (pps->num_tile_rows == 0 ||
            pps->num_tile_rows >= sps->height) {
            mpp_err( "num_tile_rows_minus1 out of range: %d\n",
                     pps->num_tile_rows - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }

        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }

        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        READ_ONEBIT(gb, &pps->uniform_spacing_flag );
        if (!pps->uniform_spacing_flag) {
            RK_S32 sum = 0;
            for (i = 0; i < pps->num_tile_columns - 1; i++) {
                READ_UE(gb, &bufs->column_width[i]);
                bufs->column_width[i] += 1;
                sum                   += bufs->column_width[i];
            }
            if (sum >= sps->ctb_width) {
                mpp_err( "Invalid tile widths.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->column_width[pps->num_tile_columns - 1] = sps->ctb_width - sum;

            sum = 0;
            for (i = 0; i < pps->num_tile_rows - 1; i++) {
                READ_UE(gb, &bufs->row_height[i]);
                bufs->row_height[i] += 1;
                sum                 += bufs->row_height[i];
            }
            if (sum >= sps->ctb_height) {
                mpp_err( "Invalid tile heights.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->row_height[pps->num_tile_rows - 1] = sps->ctb_height - sum;
        }
        READ_ONEBIT(gb, &pps->loop_filter_across_tiles_enabled_flag);
    }

    READ_ONEBIT(gb, &pps->seq_loop_filter_across_slices_enabled_flag);
    READ_ONEBIT(gb, &pps->deblocking_filter_control_present_flag);
    if (pps->deblocking_filter_control_present_flag) {
        READ_ONEBIT(gb, &pps->deblocking_filter_override_enabled_flag);
        READ_ONEBIT(gb, & pps->disable_dbf);
        if (!pps->disable_dbf) {
            READ_SE(gb, &pps->beta_offset);
            pps->beta_offset = pps->beta_offset * 2;
            READ_SE(gb, &pps->tc_offset);
            pps->tc_offset = pps->tc_offset * 2;
            if (pps->beta_offset / 2 < -6 || pps->beta_offset / 2 > 6) {
                mpp_err( "pps_beta_offset_div2 out of range: %d\n",
                         pps->beta_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            if (pps->tc_offset / 2 < -6 || pps->tc_offset / 2 > 6) {
                mpp_err( "pps_tc_offset_div2 out of range: %d\n",
                         pps->tc_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
        }
    }

    READ_ONEBIT(gb, &pps->scaling_list_data_present_flag);
    if (pps->scaling_list_data_present_flag) {
        set_default_scaling_list_data(&pps->scaling_list);
        ret = scaling_list_data(s, &pps->scaling_list, sps);

        if (ret < 0)
            goto err;
        s->scaling_list_listen[pps_id + 16] = 1;
    }

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_ONEBIT(gb, & pps->lists_modification_present_flag);


    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_UE(gb, &pps->log2_parallel_merge_level);

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    pps->log2_parallel_merge_level += 2;
    if (pps->log2_parallel_merge_level > sps->log2_ctb_size) {
        mpp_err( "log2_parallel_merge_level_minus2 out of range: %d\n",
                 pps->log2_parallel_merge_level - 2);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->slice_header_extension_present_flag);
    READ_ONEBIT(gb, &pps->pps_extension_flag);
    h265d_dbg(H265D_DBG_PPS, "pps_extension_flag %d", pps->pps_extension_flag);
    if (pps->pps_extension_flag) {
        READ_ONEBIT(gb, &pps->pps_range_extensions_flag);
        SKIP_BITS(gb, 7); // pps_extension_7bits
    }

    if (s->h265dctx->compare_info != NULL) {
        CurrentFameInf_t *info = (CurrentFameInf_t *)s->h265dctx->compare_info;
        HEVCPPS *openhevc_pps = (HEVCPPS*)&info->pps[pps_id];
        mpp_log("compare pps in");
        if (compare_pps(openhevc_pps, (HEVCPPS*)pps) < 0) {
            mpp_err("compare pps with openhevc error found");
            mpp_assert(0);
            return -1;
        }
        mpp_log("compare pps ok");
    }

    // Inferred parameters
    if (pps->uniform_spacing_flag) {
        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }
        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        for (i = 0; i < pps->num_tile_columns; i++) {
            bufs->column_width[i] = ((i + 1) * sps->ctb_width) / pps->num_tile_columns -
                                    (i * sps->ctb_width) / pps->num_tile_columns;
        }

        for (i = 0; i < pps->num_tile_rows; i++) {
            bufs->row_height[i] = ((i + 1) * sps->ctb_height) / pps->num_tile_rows -
                                  (i * sps->ctb_height) / pps->num_tile_rows;
        }
    }

    if (s->pps_list[pps_id]) {
        memcpy(s->pps_list[pps_id], pps, sizeof(*pps) - sizeof(pps->bufs));
        mpp_hevc_pps_free((RK_U8 *)pps);
    } else {
        s->pps_list[pps_id] = (RK_U8 *)pps;
    }
    s->ps_need_upate = 1;

    if (s->pps_list[pps_id])
        s->pps_list_of_updated[pps_id] = 1;

    return 0;
__BITREAD_ERR:
    ret = MPP_ERR_STREAM;
err:
    if (pps)
        mpp_hevc_pps_free((RK_U8 *)pps);

    return ret;
}